

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O2

void ppMod(word *r,word *a,size_t n,word *b,size_t m,void *stack)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  size_t sVar17;
  size_t sVar18;
  word *b_00;
  ulong uVar19;
  word wVar20;
  ulong uVar21;
  ulong n_00;
  ulong uVar22;
  long lVar23;
  size_t local_50;
  
  sVar17 = wwBitSize(a,n);
  sVar18 = wwBitSize(b,m);
  if (sVar17 < sVar18) {
    stack = a;
    if (n <= m && m - n != 0) {
      wwSetZero(r + n,m - n);
      m = n;
    }
  }
  else {
    puVar1 = (undefined8 *)((long)stack + n * 8);
    b_00 = puVar1 + 1;
    lVar15 = m * 8 + n * 8 + 8;
    wwCopy((word *)stack,a,n);
    *puVar1 = 0;
    wwCopy(b_00,b,m);
    sVar17 = wwBitSize(b + (m - 1),1);
    uVar16 = (int)sVar17 - 1U & 0x3f;
    if (uVar16 == 0) {
      n_00 = m - 1;
      r[m - 1] = 0;
      local_50 = 0;
    }
    else {
      local_50 = 0x40 - (ulong)uVar16;
      wwShHi((word *)stack,n + 1,local_50);
      wwShHi(b_00,m,local_50);
      n_00 = m;
    }
    lVar14 = m * 8 + n * 8;
    *(undefined8 *)((long)stack + lVar14 + 8) = 0;
    *(undefined8 *)((long)stack + lVar14 + 0x10) = 1;
    *(ulong *)((long)stack + lVar14 + 0x18) =
         *(ulong *)((long)stack + (*(long *)((long)stack + n_00 * 8 + n * 8) >> 0x3f) * -8 + lVar15)
         ^ 2;
    *(ulong *)((long)stack + lVar14 + 0x20) =
         *(ulong *)((long)stack +
                   (ulong)(-1 < *(long *)((long)stack + n_00 * 8 + n * 8)) * 8 + lVar15) ^ 2;
    *(ulong *)((long)stack + lVar14 + 0x28) =
         *(ulong *)((long)stack + (*(ulong *)((long)stack + n_00 * 8 + n * 8) >> 0x3e) * 8 + lVar15)
         ^ 4;
    *(ulong *)((long)stack + lVar14 + 0x30) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + n_00 * 8 + n * 8) >> 0x3e) ^
                          1) * 8 + lVar15) ^ 4;
    *(ulong *)((long)stack + lVar14 + 0x38) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + n_00 * 8 + n * 8) >> 0x3e) ^
                          2) * 8 + lVar15) ^ 4;
    *(ulong *)((long)stack + lVar14 + 0x40) =
         *(ulong *)((long)stack + (~*(ulong *)((long)stack + n_00 * 8 + n * 8) >> 0x3e) * 8 + lVar15
                   ) ^ 4;
    *(ulong *)((long)stack + lVar14 + 0x48) =
         *(ulong *)((long)stack + (*(ulong *)((long)stack + n_00 * 8 + n * 8) >> 0x3d) * 8 + lVar15)
         ^ 8;
    *(ulong *)((long)stack + lVar14 + 0x50) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + n_00 * 8 + n * 8) >> 0x3d) ^
                          1) * 8 + lVar15) ^ 8;
    *(ulong *)((long)stack + lVar14 + 0x58) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + n_00 * 8 + n * 8) >> 0x3d) ^
                          2) * 8 + lVar15) ^ 8;
    *(ulong *)((long)stack + lVar14 + 0x60) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + n_00 * 8 + n * 8) >> 0x3d) ^
                          3) * 8 + lVar15) ^ 8;
    *(ulong *)((long)stack + lVar14 + 0x68) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + n_00 * 8 + n * 8) >> 0x3d) ^
                          4) * 8 + lVar15) ^ 8;
    *(ulong *)((long)stack + lVar14 + 0x70) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + n_00 * 8 + n * 8) >> 0x3d) ^
                          5) * 8 + lVar15) ^ 8;
    *(ulong *)((long)stack + lVar14 + 0x78) =
         *(ulong *)((long)stack +
                   (ulong)((uint)((ulong)*(undefined8 *)((long)stack + n_00 * 8 + n * 8) >> 0x3d) ^
                          6) * 8 + lVar15) ^ 8;
    *(ulong *)((long)stack + lVar14 + 0x80) =
         *(ulong *)((long)stack + (~*(ulong *)((long)stack + n_00 * 8 + n * 8) >> 0x3d) * 8 + lVar15
                   ) ^ 8;
    *(undefined8 *)((long)stack + lVar14 + 0x88) = 0;
    lVar23 = *(long *)((long)stack + n_00 * 8 + n * 8);
    *(long *)((long)stack + lVar14 + 0x90) = lVar23;
    *(long *)((long)stack + lVar14 + 0x98) = lVar23 * 2;
    uVar19 = lVar23 * 2 ^ *(ulong *)((long)stack + n_00 * 8 + n * 8);
    *(ulong *)((long)stack + lVar14 + 0xa0) = uVar19;
    *(long *)((long)stack + lVar14 + 0xa8) = lVar23 * 4;
    uVar21 = lVar23 * 4 ^ *(ulong *)((long)stack + n_00 * 8 + n * 8);
    *(ulong *)((long)stack + lVar14 + 0xb0) = uVar21;
    *(ulong *)((long)stack + lVar14 + 0xb8) = uVar19 * 2;
    uVar22 = uVar19 * 2 ^ *(ulong *)((long)stack + n_00 * 8 + n * 8);
    *(ulong *)((long)stack + lVar14 + 0xc0) = uVar22;
    *(long *)((long)stack + lVar14 + 200) = lVar23 << 3;
    *(ulong *)((long)stack + lVar14 + 0xd0) =
         lVar23 << 3 ^ *(ulong *)((long)stack + n_00 * 8 + n * 8);
    uVar21 = uVar21 * 2;
    *(ulong *)((long)stack + lVar14 + 0xd8) = uVar21;
    *(ulong *)((long)stack + lVar14 + 0xe0) = uVar21 ^ *(ulong *)((long)stack + n_00 * 8 + n * 8);
    *(ulong *)((long)stack + lVar14 + 0xe8) = uVar19 << 2;
    *(ulong *)((long)stack + lVar14 + 0xf0) =
         uVar19 << 2 ^ *(ulong *)((long)stack + n_00 * 8 + n * 8);
    uVar22 = uVar22 * 2;
    *(ulong *)((long)stack + lVar14 + 0xf8) = uVar22;
    *(ulong *)((long)stack + lVar14 + 0x100) = uVar22 ^ *(ulong *)((long)stack + n_00 * 8 + n * 8);
    lVar23 = n * 8 + n_00 * -8;
    for (sVar17 = n; n_00 <= sVar17; sVar17 = sVar17 - 1) {
      uVar21 = *(ulong *)((long)stack + sVar17 * 8);
      lVar2 = *(long *)((long)stack + (uVar21 >> 0x3c) * 8 + lVar15);
      uVar21 = *(ulong *)((long)stack + (ulong)((uint)lVar2 & 0xf) * 8 + lVar15 + 0x80) >> 4 ^
               uVar21;
      lVar3 = *(long *)((long)stack + (ulong)((byte)(uVar21 >> 0x38) & 0xf) * 8 + lVar15);
      uVar21 = *(ulong *)((long)stack + (ulong)((uint)lVar3 & 0xf) * 8 + lVar15 + 0x80) >> 8 ^
               uVar21;
      uVar22 = *(ulong *)((long)stack + (ulong)((uint)(uVar21 >> 0x34) & 0xf) * 8 + lVar15);
      uVar21 = *(ulong *)((long)stack + (ulong)((uint)uVar22 & 0xf) * 8 + lVar15 + 0x80) >> 0xc ^
               uVar21;
      lVar4 = *(long *)((long)stack + (ulong)((ushort)(uVar21 >> 0x30) & 0xf) * 8 + lVar15);
      uVar21 = *(ulong *)((long)stack + (ulong)((uint)lVar4 & 0xf) * 8 + lVar15 + 0x80) >> 0x10 ^
               uVar21;
      uVar19 = *(ulong *)((long)stack + (ulong)((uint)(uVar21 >> 0x2c) & 0xf) * 8 + lVar15);
      uVar21 = *(ulong *)((long)stack + (ulong)((uint)uVar19 & 0xf) * 8 + lVar15 + 0x80) >> 0x14 ^
               uVar21;
      lVar5 = *(long *)((long)stack + (ulong)((uint)(uVar21 >> 0x28) & 0xf) * 8 + lVar15);
      uVar21 = *(ulong *)((long)stack + (ulong)((uint)lVar5 & 0xf) * 8 + lVar15 + 0x80) >> 0x18 ^
               uVar21;
      uVar6 = *(ulong *)((long)stack + (ulong)((uint)(uVar21 >> 0x24) & 0xf) * 8 + lVar15);
      uVar21 = *(ulong *)((long)stack + (ulong)((uint)uVar6 & 0xf) * 8 + lVar15 + 0x80) >> 0x1c ^
               uVar21;
      lVar7 = *(long *)((long)stack + (ulong)((uint)(uVar21 >> 0x20) & 0xf) * 8 + lVar15);
      uVar16 = (uint)uVar21 ^
               *(uint *)((long)stack + (ulong)((uint)lVar7 & 0xf) * 8 + lVar15 + 0x84);
      uVar21 = *(ulong *)((long)stack + (ulong)(uVar16 >> 0x1c) * 8 + lVar15);
      uVar16 = (uint)((ulong)*(undefined8 *)
                              ((long)stack + (ulong)((uint)uVar21 & 0xf) * 8 + lVar15 + 0x80) >>
                     0x24) ^ uVar16;
      lVar8 = *(long *)((long)stack + (ulong)(uVar16 >> 0x15 & 0x78) + lVar15);
      uVar16 = (uint)((ulong)*(undefined8 *)
                              ((long)stack + (ulong)((uint)lVar8 & 0xf) * 8 + lVar15 + 0x80) >> 0x28
                     ) ^ uVar16;
      uVar9 = *(ulong *)((long)stack + (ulong)(uVar16 >> 0x11 & 0x78) + lVar15);
      uVar16 = (uint)((ulong)*(undefined8 *)
                              ((long)stack + (ulong)((uint)uVar9 & 0xf) * 8 + lVar15 + 0x80) >> 0x2c
                     ) ^ uVar16;
      lVar10 = *(long *)((long)stack + (ulong)(uVar16 >> 0xd & 0x78) + lVar15);
      uVar16 = *(ushort *)((long)stack + (ulong)((uint)lVar10 & 0xf) * 8 + lVar15 + 0x86) ^ uVar16;
      uVar11 = *(ulong *)((long)stack + (ulong)(uVar16 >> 9 & 0x78) + lVar15);
      uVar16 = (uint)((ulong)*(undefined8 *)
                              ((long)stack + (ulong)((uint)uVar11 & 0xf) * 8 + lVar15 + 0x80) >>
                     0x34) ^ uVar16;
      lVar12 = *(long *)((long)stack + (ulong)(uVar16 >> 5 & 0x78) + lVar15);
      uVar16 = *(byte *)((long)stack + (ulong)((uint)lVar12 & 0xf) * 8 + lVar15 + 0x87) ^ uVar16;
      uVar13 = *(ulong *)((long)stack + (ulong)(uVar16 >> 1 & 0x78) + lVar15);
      uVar21 = (lVar12 << 4 ^
                (lVar10 << 4 ^
                 (lVar8 << 4 ^
                  (lVar7 << 4 ^
                   (lVar5 << 4 ^
                    (lVar4 << 4 ^ (lVar3 << 4 ^ lVar2 << 8 ^ uVar22) << 8 ^ uVar19) << 8 ^ uVar6) <<
                   8 ^ uVar21) << 8 ^ uVar9) << 8 ^ uVar11) << 8 ^ uVar13) << 4 ^
               *(ulong *)((long)stack +
                         (ulong)((uint)((ulong)*(undefined8 *)
                                                ((long)stack +
                                                (ulong)((uint)uVar13 & 0xf) * 8 + lVar15 + 0x80) >>
                                       0x3c) ^ uVar16 & 0xf) * 8 + lVar15);
      wVar20 = ppAddMulW((word *)((long)stack + lVar23),b_00,n_00,uVar21,
                         (void *)((long)stack + lVar14 + 0x108));
      *(word *)((long)stack + sVar17 * 8) = wVar20 ^ *(ulong *)((long)stack + sVar17 * 8) ^ uVar21;
      lVar23 = lVar23 + -8;
    }
    wwShLo((word *)stack,n + 1,local_50);
    m = n_00;
  }
  wwCopy(r,(word *)stack,m);
  return;
}

Assistant:

void ppMod(word r[], const word a[], size_t n, const word b[], size_t m,
	void* stack)
{
	register word dividentHi;
	register word tmp;
	register size_t shift;
	size_t i;
	// переменные в stack
	word* divident;		/* нормализованное делимое (n + 1 слово) */
	word* divisor;		/* нормализованный делитель (m слов) */
	word* w1;			/* таблица частных (16 слов) */
	word* w2;			/* таблица умножения (16 слов) */
	// pre
	ASSERT(wwIsValid(a, n) && wwIsValid(b, m));
	ASSERT(m > 0 && b[m - 1] > 0);
	ASSERT(a == r || wwIsDisjoint2(a, n, r, m));
	// deg(a) < deg(b)?
	if (wwBitSize(a, n) < wwBitSize(b, m))
	{
		// r <- a
		if (n < m)
			wwSetZero(r + n, m - n), m = n;
		wwCopy(r, a, m);
		return;
	}
	// резервируем переменные в stack
	divident = (word*)stack;
	divisor = divident + n + 1;
	w1 = divisor + m;
	w2 = w1 + 16;
	stack = w2 + 16;
	// divident <- a
	wwCopy(divident, a, n);
	divident[n] = 0;
	// divisor <- b
	wwCopy(divisor, b, m);
	// нормализация -- сделать старший разряд divisor первым в старшем
	// (возможно неявном) слове
	shift = (wwBitSize(b + m - 1, 1) - 1) % B_PER_W;
	// нормализация не нужна?
	if (shift == 0)
		// обнуляем старшее слово r
		r[--m] = 0;
	else
		// сдвигаем divisor и divident
		shift = B_PER_W - shift,
		wwShHi(divident, n + 1, shift),
		wwShHi(divisor, m, shift);
	// строим таблицы
	_DIV_PRE_S4(w1, divisor[m - 1]);
	_MUL_PRE_S4(w2, divisor[m - 1]);
	// цикл по разрядам делимого
	for (i = n; i >= m; --i)
	{
		// tmp <- divident[i] \div (1, divisor[m - 1])
		dividentHi = divident[i];
		_DIV_DIV_S4(dividentHi, tmp, w1, w2);
		// divident <- divident - divisor * X^{i - m} * tmp
		divident[i] ^=
			ppAddMulW(divident + i - m, divisor, m, tmp, stack);
		// обработаем неявный старший разряд divisor
		divident[i] ^= tmp;
	}
	// денормализация
	wwShLo(divident, n + 1, shift);
	// сохранить остаток
	wwCopy(r, divident, m);
	// очистить регистровые переменные
	shift = 0;
	tmp = 0;
	dividentHi = 0;
}